

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O0

void __thiscall glu::Shader::compile(Shader *this)

{
  GLuint GVar1;
  glGetShaderInfoLogFunc p_Var2;
  GLenum GVar3;
  int iVar4;
  deUint64 dVar5;
  size_type sVar6;
  reference pvVar7;
  allocator<char> local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [54];
  allocator_type local_42;
  value_type local_41;
  undefined1 local_40 [8];
  vector<char,_std::allocator<char>_> infoLog;
  GLint local_20;
  int unusedLen;
  int infoLogLen;
  int compileStatus;
  deUint64 compileStart;
  Shader *this_local;
  
  (this->m_info).compileOk = false;
  (this->m_info).compileTimeUs = 0;
  compileStart = (deUint64)this;
  std::__cxx11::string::clear();
  _infoLogLen = deGetMicroseconds();
  (*this->m_gl->compileShader)(this->m_shader);
  dVar5 = deGetMicroseconds();
  (this->m_info).compileTimeUs = dVar5 - _infoLogLen;
  GVar3 = (*this->m_gl->getError)();
  checkError(GVar3,"glCompileShader()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluShaderProgram.cpp"
             ,0x5a);
  unusedLen = 0;
  (*this->m_gl->getShaderiv)(this->m_shader,0x8b81,&unusedLen);
  GVar3 = (*this->m_gl->getError)();
  checkError(GVar3,"glGetShaderiv()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluShaderProgram.cpp"
             ,0x61);
  (this->m_info).compileOk = unusedLen != 0;
  local_20 = 0;
  (*this->m_gl->getShaderiv)(this->m_shader,0x8b84,&local_20);
  GVar3 = (*this->m_gl->getError)();
  checkError(GVar3,"glGetShaderiv()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluShaderProgram.cpp"
             ,0x6c);
  if (0 < local_20) {
    iVar4 = local_20 + 3;
    local_41 = '\0';
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_40,(long)iVar4,&local_41,&local_42);
    std::allocator<char>::~allocator(&local_42);
    p_Var2 = this->m_gl->getShaderInfoLog;
    GVar1 = this->m_shader;
    sVar6 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)local_40);
    pvVar7 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_40,0);
    (*p_Var2)(GVar1,(int)sVar6 + -1,
              (GLsizei *)&infoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x14
              ,pvVar7);
    sVar6 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)local_40);
    pvVar7 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_40,(long)((int)sVar6 + -1));
    if (*pvVar7 == '\0') {
      pvVar7 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_40,0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_a0,pvVar7,&local_a1);
      std::__cxx11::string::operator=((string *)&(this->m_info).infoLog,local_a0);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator(&local_a1);
    }
    else {
      pvVar7 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_40,0);
      sVar6 = std::vector<char,_std::allocator<char>_>::size
                        ((vector<char,_std::allocator<char>_> *)local_40);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,pvVar7,sVar6,&local_79);
      std::__cxx11::string::operator=((string *)&(this->m_info).infoLog,local_78);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
    }
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_40);
  }
  return;
}

Assistant:

void Shader::compile (void)
{
	m_info.compileOk		= false;
	m_info.compileTimeUs	= 0;
	m_info.infoLog.clear();

	{
		deUint64 compileStart = deGetMicroseconds();
		m_gl.compileShader(m_shader);
		m_info.compileTimeUs = deGetMicroseconds() - compileStart;
	}

	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCompileShader()");

	// Query status
	{
		int compileStatus = 0;

		m_gl.getShaderiv(m_shader, GL_COMPILE_STATUS, &compileStatus);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetShaderiv()");

		m_info.compileOk = compileStatus != GL_FALSE;
	}

	// Query log
	{
		int infoLogLen = 0;
		int unusedLen;

		m_gl.getShaderiv(m_shader, GL_INFO_LOG_LENGTH, &infoLogLen);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetShaderiv()");

		if (infoLogLen > 0)
		{
			// The INFO_LOG_LENGTH query and the buffer query implementations have
			// very commonly off-by-one errors. Try to work around these issues.

			// add tolerance for off-by-one in log length, buffer write, and for terminator
			std::vector<char> infoLog(infoLogLen + 3, '\0');

			// claim buf size is one smaller to protect from off-by-one writing over buffer bounds
			m_gl.getShaderInfoLog(m_shader, (int)infoLog.size() - 1, &unusedLen, &infoLog[0]);

			if (infoLog[(int)(infoLog.size()) - 1] != '\0')
			{
				// return whole buffer if null terminator was overwritten
				m_info.infoLog = std::string(&infoLog[0], infoLog.size());
			}
			else
			{
				// read as C string. infoLog is guaranteed to be 0-terminated
				m_info.infoLog = std::string(&infoLog[0]);
			}
		}
	}
}